

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RngStream.cpp
# Opt level: O3

void anon_unknown.dwarf_8788::MatVecModM(double (*A) [3],double *s,double *v,double m)

{
  double s_00;
  double s_01;
  double s_02;
  double dVar1;
  double *pdVar2;
  long lVar3;
  double x [3];
  double local_38 [4];
  
  s_00 = *s;
  s_01 = s[1];
  s_02 = s[2];
  pdVar2 = *A + 2;
  lVar3 = 0;
  do {
    dVar1 = MultModM((*(double (*) [3])(pdVar2 + -2))[0],s_00,0.0,m);
    dVar1 = MultModM(pdVar2[-1],s_01,dVar1,m);
    dVar1 = MultModM(*pdVar2,s_02,dVar1,m);
    local_38[lVar3] = dVar1;
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar3 != 3);
  v[2] = local_38[2];
  *v = local_38[0];
  v[1] = local_38[1];
  return;
}

Assistant:

void MatVecModM (const double A[3][3], const double s[3], double v[3],
                 double m)
{
    int i;
    double x[3];               // Necessary if v = s

    for (i = 0; i < 3; ++i) {
        x[i] = MultModM (A[i][0], s[0], 0.0, m);
        x[i] = MultModM (A[i][1], s[1], x[i], m);
        x[i] = MultModM (A[i][2], s[2], x[i], m);
    }
    for (i = 0; i < 3; ++i)
        v[i] = x[i];
}